

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall AlternativeLoader::AlternativeLoader(AlternativeLoader *this,string *mapFile)

{
  string *this_00;
  string *mapFile_local;
  AlternativeLoader *this_local;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)mapFile);
  this->pDominationMapFile = this_00;
  return;
}

Assistant:

AlternativeLoader::AlternativeLoader(const std::string& mapFile) {
    pDominationMapFile = new std::string(mapFile);
}